

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ConcurrentDatabase::get_hash_list_for_resource_tag
          (ConcurrentDatabase *this,ResourceTag tag,size_t *num_hashes,Hash *hashes)

{
  bool bVar1;
  uint uVar2;
  Hash HVar3;
  reference puVar4;
  pointer pDVar5;
  ulong uVar6;
  unsigned_long *blob;
  iterator __end3;
  iterator __begin3;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range3;
  Hash *iter;
  size_t total_size;
  size_t writeonly_size;
  size_t readonly_size;
  size_t total_size_1;
  Hash *hashes_local;
  size_t *num_hashes_local;
  ConcurrentDatabase *pCStack_18;
  ResourceTag tag_local;
  ConcurrentDatabase *this_local;
  
  total_size_1 = (size_t)hashes;
  hashes_local = num_hashes;
  num_hashes_local._4_4_ = tag;
  pCStack_18 = this;
  if (((this->super_DatabaseInterface).impl)->imported_concurrent_metadata !=
      (ExportedMetadataHeader *)0x0) {
    readonly_size =
         ((this->super_DatabaseInterface).impl)->imported_concurrent_metadata->lists[tag].count;
    if (hashes == (Hash *)0x0) {
      *num_hashes = readonly_size;
    }
    else if (readonly_size != *num_hashes) {
      return false;
    }
    if (hashes != (Hash *)0x0) {
      memcpy(hashes,(void *)((long)&((ExportedMetadataHeader *)
                                    (((this->super_DatabaseInterface).impl)->
                                     imported_concurrent_metadata->lists + -1))->magic +
                            ((this->super_DatabaseInterface).impl)->imported_concurrent_metadata->
                            lists[tag].offset),readonly_size << 3);
    }
    return true;
  }
  writeonly_size =
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::size(this->primed_hashes + tag);
  total_size = 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->writeonly_interface);
  if (bVar1) {
    pDVar5 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->writeonly_interface);
    uVar2 = (*pDVar5->_vptr_DatabaseInterface[6])
                      (pDVar5,(ulong)num_hashes_local._4_4_,&total_size,0);
    if ((uVar2 & 1) != 0) goto LAB_00118bc9;
  }
  total_size = 0;
LAB_00118bc9:
  HVar3 = writeonly_size + total_size;
  if (total_size_1 == 0) {
    *hashes_local = HVar3;
  }
  else if (HVar3 != *hashes_local) {
    return false;
  }
  if (total_size_1 != 0) {
    __range3 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)total_size_1;
    uVar6 = (ulong)num_hashes_local._4_4_;
    __end3 = std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(this->primed_hashes + uVar6);
    blob = (unsigned_long *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(this->primed_hashes + uVar6);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.super__Node_iterator_base<unsigned_long,_false>,
                              (_Node_iterator_base<unsigned_long,_false> *)&blob), bVar1) {
      puVar4 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*(&__end3);
      (__range3->_M_h)._M_buckets = (__buckets_ptr)*puVar4;
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++(&__end3);
      __range3 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&(__range3->_M_h)._M_bucket_count;
    }
    if (total_size != 0) {
      pDVar5 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->(&this->writeonly_interface);
      uVar2 = (*pDVar5->_vptr_DatabaseInterface[6])
                        (pDVar5,(ulong)num_hashes_local._4_4_,&total_size,__range3);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    std::sort<unsigned_long*>
              ((unsigned_long *)total_size_1,(unsigned_long *)(total_size_1 + HVar3 * 8));
  }
  return true;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *num_hashes, Hash *hashes) override
	{
		if (impl->imported_concurrent_metadata)
		{
			size_t total_size = impl->imported_concurrent_metadata->lists[tag].count;

			if (hashes)
			{
				if (total_size != *num_hashes)
					return false;
			}
			else
				*num_hashes = total_size;

			if (hashes)
			{
				memcpy(hashes,
				       reinterpret_cast<const uint8_t *>(impl->imported_concurrent_metadata) +
				       impl->imported_concurrent_metadata->lists[tag].offset,
				       total_size * sizeof(*hashes));
			}
			return true;
		}

		size_t readonly_size = primed_hashes[tag].size();

		size_t writeonly_size = 0;
		if (!writeonly_interface || !writeonly_interface->get_hash_list_for_resource_tag(tag, &writeonly_size, nullptr))
			writeonly_size = 0;

		size_t total_size = readonly_size + writeonly_size;

		if (hashes)
		{
			if (total_size != *num_hashes)
				return false;
		}
		else
			*num_hashes = total_size;

		if (hashes)
		{
			Hash *iter = hashes;
			for (auto &blob : primed_hashes[tag])
				*iter++ = blob;

			if (writeonly_size != 0 && !writeonly_interface->get_hash_list_for_resource_tag(tag, &writeonly_size, iter))
				return false;

			// Make replay more deterministic.
			sort(hashes, hashes + total_size);
		}

		return true;
	}